

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_partial_forceExtDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              void *dictStart,size_t dictSize)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  long lVar9;
  ushort *puVar10;
  ushort *puVar11;
  ushort *__src;
  ulong __n;
  BYTE *d_1;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  BYTE *d;
  char *pcVar16;
  char *__dest;
  ulong uVar17;
  BYTE *s;
  int local_70;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar15 = -1;
  if (-1 < dstCapacity && source != (char *)0x0) {
    lVar9 = dictSize + (long)dictStart;
    if (dictStart == (void *)0x0) {
      lVar9 = 0;
    }
    if (dstCapacity == 0) {
      iVar15 = 0;
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(source + compressedSize);
      pcVar2 = dest + (uint)dstCapacity;
      __dest = dest;
      puVar11 = (ushort *)source;
LAB_0011954b:
      __src = (ushort *)((long)puVar11 + 1);
      bVar3 = (byte)*puVar11;
      uVar13 = (ulong)(uint)(bVar3 >> 4);
      if (bVar3 >> 4 == 0xf) {
        if (pbVar1 + -0xf <= __src) goto LAB_00119947;
        puVar11 = puVar11 + 1;
        lVar12 = 0;
        puVar10 = __src;
        do {
          __src = (ushort *)((long)puVar10 + 1);
          if (pbVar1 + -0xf < __src) goto LAB_00119947;
          uVar7 = *puVar10;
          lVar12 = lVar12 + (ulong)(byte)uVar7;
          puVar11 = (ushort *)((long)puVar11 + 1);
          puVar10 = __src;
        } while ((ulong)(byte)uVar7 == 0xff);
        if (((lVar12 == -1) || (uVar13 = lVar12 + 0xf, CARRY8((ulong)__dest,uVar13))) ||
           ((ulong)-(long)puVar11 < uVar13)) goto LAB_00119947;
LAB_001195bc:
        pcVar16 = __dest + uVar13;
        if ((pcVar2 + -0xc < pcVar16) ||
           (puVar11 = (ushort *)((long)__src + uVar13), pbVar1 + -8 < puVar11)) {
          pcVar14 = pcVar16;
          if (pbVar1 < (byte *)((long)__src + uVar13)) {
            pcVar14 = __dest + ((long)pbVar1 - (long)__src);
          }
          if (pcVar2 < pcVar14) {
            memmove(__dest,__src,(long)pcVar2 - (long)__dest);
            pcVar16 = pcVar2;
            goto LAB_0011993c;
          }
          if (pbVar1 < (byte *)((long)__src + uVar13)) {
            uVar13 = (long)pbVar1 - (long)__src;
          }
          memmove(__dest,__src,uVar13);
          pcVar16 = __dest + uVar13;
          if ((pcVar14 == pcVar2) ||
             (puVar11 = (ushort *)((long)__src + uVar13), pbVar1 + -2 <= puVar11))
          goto LAB_0011993c;
        }
        else {
          do {
            *(undefined8 *)__dest = *(undefined8 *)__src;
            __dest = __dest + 8;
            __src = __src + 4;
          } while (__dest < pcVar16);
        }
        uVar7 = *puVar11;
        __src = puVar11 + 1;
        pcVar14 = pcVar16 + -(ulong)uVar7;
        uVar17 = (ulong)(bVar3 & 0xf);
      }
      else {
        if ((source + (long)compressedSize + -0x10 <= __src) ||
           (dest + ((ulong)(uint)dstCapacity - 0x20) < __dest)) goto LAB_001195bc;
        uVar6 = *(undefined8 *)((long)puVar11 + 9);
        *(undefined8 *)__dest = *(undefined8 *)__src;
        *(undefined8 *)(__dest + 8) = uVar6;
        pcVar16 = __dest + uVar13;
        uVar17 = (ulong)(bVar3 & 0xf);
        puVar11 = (ushort *)((long)__src + uVar13);
        __src = puVar11 + 1;
        uVar7 = *puVar11;
        pcVar14 = pcVar16 + -(ulong)uVar7;
        if (((uVar17 != 0xf) && (7 < uVar7)) && (dest <= pcVar14)) {
          *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
          *(undefined8 *)(pcVar16 + 8) = *(undefined8 *)(pcVar14 + 8);
          *(undefined2 *)(pcVar16 + 0x10) = *(undefined2 *)(pcVar14 + 0x10);
          __dest = pcVar16 + uVar17 + 4;
          puVar11 = __src;
          goto LAB_0011954b;
        }
      }
      if ((int)uVar17 == 0xf) {
        lVar12 = 0;
        puVar11 = __src;
        do {
          __src = (ushort *)((long)puVar11 + 1);
          if (pbVar1 + -4 < __src) goto LAB_00119947;
          uVar8 = *puVar11;
          lVar12 = lVar12 + (ulong)(byte)uVar8;
          puVar11 = __src;
        } while ((ulong)(byte)uVar8 == 0xff);
        uVar17 = lVar12 + 0xf;
        if ((lVar12 == -1) || (CARRY8((ulong)pcVar16,uVar17))) goto LAB_00119947;
      }
      if ((dictSize < 0x10000) && (pcVar14 + dictSize < dest)) {
LAB_00119947:
        local_70 = (int)source;
        return ~(uint)__src + local_70;
      }
      uVar17 = uVar17 + 4;
      __dest = pcVar16 + uVar17;
      puVar11 = __src;
      if (pcVar14 < dest) {
        if ((pcVar2 + -5 < __dest) && ((ulong)((long)pcVar2 - (long)pcVar16) <= uVar17)) {
          uVar17 = (long)pcVar2 - (long)pcVar16;
        }
        __n = (long)dest - (long)pcVar14;
        uVar13 = uVar17 - __n;
        if (uVar17 < __n || uVar13 == 0) {
          memmove(pcVar16,(void *)(lVar9 - __n),uVar17);
          __dest = pcVar16 + uVar17;
        }
        else {
          memcpy(pcVar16,(void *)(lVar9 - __n),__n);
          __dest = pcVar16 + __n;
          if ((ulong)((long)__dest - (long)dest) < uVar13) {
            if ((long)__n < (long)uVar17) {
              pcVar14 = dest;
              do {
                cVar4 = *pcVar14;
                pcVar14 = pcVar14 + 1;
                *__dest = cVar4;
                __dest = __dest + 1;
              } while (__dest < pcVar16 + uVar17);
            }
          }
          else {
            memcpy(__dest,dest,uVar13);
            __dest = pcVar16 + uVar17;
          }
        }
        goto LAB_0011954b;
      }
      if (__dest <= pcVar2 + -0xc) {
        if (uVar7 < 8) {
          pcVar16[0] = '\0';
          pcVar16[1] = '\0';
          pcVar16[2] = '\0';
          pcVar16[3] = '\0';
          *pcVar16 = *pcVar14;
          pcVar16[1] = pcVar14[1];
          pcVar16[2] = pcVar14[2];
          pcVar16[3] = pcVar14[3];
          uVar5 = inc32table[uVar7];
          *(undefined4 *)(pcVar16 + 4) = *(undefined4 *)(pcVar14 + uVar5);
          pcVar14 = pcVar14 + ((ulong)uVar5 - (long)dec64table[uVar7]);
        }
        else {
          *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
          pcVar14 = pcVar14 + 8;
        }
        *(undefined8 *)(pcVar16 + 8) = *(undefined8 *)pcVar14;
        if (0x10 < uVar17) {
          pcVar16 = pcVar16 + 0x10;
          do {
            pcVar14 = pcVar14 + 8;
            *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
            pcVar16 = pcVar16 + 8;
          } while (pcVar16 < __dest);
        }
        goto LAB_0011954b;
      }
      uVar13 = (long)pcVar2 - (long)pcVar16;
      if (uVar17 < (ulong)((long)pcVar2 - (long)pcVar16)) {
        uVar13 = uVar17;
      }
      __dest = pcVar16 + uVar13;
      if (pcVar16 < pcVar14 + uVar13) {
        if (0 < (long)uVar13) {
          do {
            cVar4 = *pcVar14;
            pcVar14 = pcVar14 + 1;
            *pcVar16 = cVar4;
            pcVar16 = pcVar16 + 1;
          } while (pcVar16 < __dest);
        }
      }
      else {
        memcpy(pcVar16,pcVar14,uVar13);
      }
      pcVar16 = pcVar2;
      if (__dest != pcVar2) goto LAB_0011954b;
LAB_0011993c:
      iVar15 = (int)pcVar16 - (int)dest;
    }
  }
  return iVar15;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int targetOutputSize, int dstCapacity,
                                     const void* dictStart, size_t dictSize)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(source, dest, compressedSize, dstCapacity,
                                  partial_decode, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}